

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

Result __thiscall
tonk::SessionOutgoing::QueueControl(SessionOutgoing *this,uint8_t *data,size_t bytes)

{
  queueMessage(this,(uint)data,MessageType_Acknowledgements,(uint8_t *)0x1e,bytes);
  return (Result)(ErrorResult *)this;
}

Assistant:

Result SessionOutgoing::QueueControl(
    const uint8_t* data,
    size_t bytes)
{
    // WARNING: This function is not called on the Connection green thread,
    // so accessing members here is not threadsafe by default.

    // Control messages are reliable in-order but get put in the queue with
    // Unordered data so that it can be reliable and bypass bandwidth limits.
    // As a side-effect these control messages are not compressed
    return queueMessage(Queue_Unmetered, protocol::MessageType_Control, data, bytes);
}